

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O0

void prngCOMBOStep(prng_combo_st *s)

{
  prng_combo_st *s_local;
  
  (s->r).u32 = s->x * s->x;
  s->x = s->y;
  s->y = (u32)s->r;
  s->z = (s->z & 0xffff) * 0x78b7 + (s->z >> 0x10);
  (s->r).u32 = s->z + (s->r).u32;
  return;
}

Assistant:

static void prngCOMBOStep(prng_combo_st* s)
{
	s->r.u32 = s->x * s->x;
	s->x = s->y;
	s->y = s->r.u32;
	s->z = (s->z & 0xFFFF) * 30903 + (s->z >> 16);
	s->r.u32 += s->z;
#if (OCTET_ORDER == BIG_ENDIAN)
	s->r.u32 = u32Rev(s->r.u32);
#endif
}